

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.hpp
# Opt level: O2

TestNodeClass tcu::getTestNodeTypeClass(TestNodeType type)

{
  if (type < (NODETYPE_ACCURACY|NODETYPE_PACKAGE)) {
    return *(TestNodeClass *)(&DAT_0191da00 + (ulong)type * 4);
  }
  return NODECLASS_LAST;
}

Assistant:

inline TestNodeClass getTestNodeTypeClass (TestNodeType type)
{
	switch (type)
	{
		case NODETYPE_ROOT:				return NODECLASS_GROUP;
		case NODETYPE_PACKAGE:			return NODECLASS_GROUP;
		case NODETYPE_GROUP:			return NODECLASS_GROUP;
		case NODETYPE_SELF_VALIDATE:	return NODECLASS_EXECUTABLE;
		case NODETYPE_PERFORMANCE:		return NODECLASS_EXECUTABLE;
		case NODETYPE_CAPABILITY:		return NODECLASS_EXECUTABLE;
		case NODETYPE_ACCURACY:			return NODECLASS_EXECUTABLE;
		default:
			DE_ASSERT(false);
			return NODECLASS_LAST;
	}
}